

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

size_t enet_range_coder_decompress
                 (void *context,enet_uint8 *inData,size_t inLimit,enet_uint8 *outData,
                 size_t outLimit)

{
  ENetSymbol *pEVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  bool bVar5;
  ushort uVar6;
  enet_uint16 eVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  enet_uint16 *peVar11;
  short sVar12;
  enet_uint16 eVar13;
  ENetSymbol *pEVar14;
  ushort uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  byte *pbVar25;
  ushort uVar26;
  uint uVar27;
  ENetSymbol *unaff_R13;
  uint uVar28;
  enet_uint16 predicted;
  enet_uint16 local_80;
  ushort local_7e;
  uint local_7c;
  ulong local_78;
  undefined1 (*local_70) [16];
  byte *local_68;
  ulong local_60;
  ulong local_58;
  enet_uint8 *local_50;
  enet_uint8 *local_48;
  enet_uint8 *local_40;
  ENetSymbol *local_38;
  
  local_80 = 0;
  uVar8 = 0;
  if (inLimit == 0 || context == (void *)0x0) {
    return 0;
  }
  local_68 = inData + inLimit;
  *(undefined1 (*) [16])context = (undefined1  [16])0x0;
  *(undefined2 *)((long)context + 0xc) = 0x101;
  *(undefined4 *)((long)context + 8) = 0x10000;
  if (0 < (long)inLimit) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar8 = (uint)bVar21 << 0x18;
  }
  if (inData < local_68) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar8 = (uint)bVar21 << 0x10 | uVar8;
  }
  if (inData < local_68) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar8 = (uint)bVar21 << 8 | uVar8;
  }
  if (inData < local_68) {
    bVar21 = *inData;
    inData = inData + 1;
    uVar8 = uVar8 | bVar21;
  }
  local_48 = outData + outLimit;
  local_58 = 0;
  uVar18 = 0xffffffff;
  uVar28 = 0;
  uVar26 = local_80;
  local_40 = outData;
  local_50 = outData;
  local_70 = (undefined1 (*) [16])context;
  pbVar25 = local_68;
  local_78 = 1;
LAB_00102da9:
  do {
    uVar16 = local_78;
    pauVar23 = (undefined1 (*) [16])context;
    if (uVar26 == 0) {
      uVar10 = (ulong)uVar18 / (ulong)*(ushort *)(*(undefined1 (*) [16])context + 0xc);
      uVar18 = (uint)((uVar8 - uVar28) / uVar10);
      uVar6 = *(ushort *)(*(undefined1 (*) [16])context + 10);
      iVar19 = (int)uVar10;
      if ((uint)uVar6 <= (uVar18 & 0xffff)) {
        uVar18 = uVar18 - uVar6;
        if (*(ushort *)(*(undefined1 (*) [16])context + 8) == 0) {
          (*(undefined1 (*) [16])((long)context + local_78 * 0x10))[0] = (char)uVar18;
          (*(undefined1 (*) [16])((long)context + local_78 * 0x10))[1] = 3;
          *(undefined2 *)(*(undefined1 (*) [16])((long)context + local_78 * 0x10) + 2) = 3;
          *(undefined8 *)(*(undefined1 (*) [16])((long)context + local_78 * 0x10) + 4) = 0;
          *(undefined4 *)(*(undefined1 (*) [16])((long)context + local_78 * 0x10) + 0xc) = 0;
          *(short *)(*(undefined1 (*) [16])context + 8) = (short)local_78;
          unaff_R13 = (ENetSymbol *)((long)context + local_78 * 0x10);
          uVar9 = 1;
          local_78 = local_78 + 1;
          local_7c = uVar18;
        }
        else {
          pEVar14 = (ENetSymbol *)
                    ((long)context + (ulong)*(ushort *)(*(undefined1 (*) [16])context + 8) * 0x10);
          uVar20 = uVar18 & 0xffff;
          uVar9 = 1;
          local_7c = 0;
          uVar22 = 0;
          do {
            uVar6 = pEVar14->under;
            uVar27 = (uVar22 & 0xffff) + (uint)uVar6;
            bVar21 = pEVar14->value;
            uVar17 = bVar21 + uVar27 + 1;
            uVar24 = uVar17 & 0xffff;
            if (uVar20 < uVar24) {
              bVar2 = pEVar14->count;
              uVar24 = uVar24 + ~(uint)(ushort)bVar2;
              if ((int)uVar20 < (int)uVar24) {
                pEVar14->under = uVar6 + 3;
                if (pEVar14->left == 0) {
                  bVar21 = bVar21 + ((char)uVar20 - (char)uVar24);
                  local_7c = (uint)bVar21;
                  local_70[local_78][0] = bVar21;
                  local_70[local_78][1] = 3;
                  *(undefined2 *)(local_70[local_78] + 2) = 3;
                  *(undefined8 *)(local_70[local_78] + 4) = 0;
                  *(undefined4 *)(local_70[local_78] + 0xc) = 0;
                  pEVar14->left =
                       (enet_uint16)((uint)((int)(local_70 + local_78) - (int)pEVar14) >> 4);
                  goto LAB_0010300d;
                }
                pEVar14 = pEVar14 + pEVar14->left;
                bVar5 = true;
              }
              else {
                uVar9 = uVar9 + (ushort)bVar2;
                pEVar14->under = uVar6 + 3;
                pEVar14->count = bVar2 + 3;
                bVar5 = false;
                unaff_R13 = pEVar14;
                local_7c = (uint)bVar21;
                uVar22 = uVar24;
              }
            }
            else if (pEVar14->right == 0) {
              local_7c = (bVar21 + 1 + uVar20) - uVar17;
              local_70[local_78][0] = (char)local_7c;
              local_70[local_78][1] = 3;
              *(undefined2 *)(local_70[local_78] + 2) = 3;
              *(undefined8 *)(local_70[local_78] + 4) = 0;
              *(undefined4 *)(local_70[local_78] + 0xc) = 0;
              pEVar14->right = (enet_uint16)((uint)((int)(local_70 + local_78) - (int)pEVar14) >> 4)
              ;
LAB_0010300d:
              unaff_R13 = (ENetSymbol *)(local_70 + local_78);
              local_78 = local_78 + 1;
              bVar5 = false;
              uVar22 = uVar18;
            }
            else {
              pEVar14 = pEVar14 + pEVar14->right;
              bVar5 = true;
              uVar22 = uVar27;
            }
          } while (bVar5);
          uVar9 = uVar9 & 0xffff;
          context = local_70;
          pbVar25 = local_68;
          uVar18 = uVar22;
          local_7e = uVar26;
        }
        uVar28 = ((uVar18 & 0xffff) + (uint)*(ushort *)(*(undefined1 (*) [16])context + 10)) *
                 iVar19 + uVar28;
        uVar18 = iVar19 * uVar9;
        do {
          if (0xffffff < (uVar28 + uVar18 ^ uVar28)) {
            if (0xffff < uVar18) goto LAB_001030df;
            uVar18 = -uVar28 & 0xffff;
          }
          uVar8 = uVar8 << 8;
          if (inData < pbVar25) {
            bVar21 = *inData;
            inData = inData + 1;
            uVar8 = uVar8 | bVar21;
          }
          uVar18 = uVar18 << 8;
          uVar28 = uVar28 << 8;
        } while( true );
      }
      uVar18 = iVar19 * (uint)uVar6;
      do {
        if (0xffffff < (uVar28 + uVar18 ^ uVar28)) {
          if (0xffff < uVar18) goto LAB_00103045;
          uVar18 = -uVar28 & 0xffff;
        }
        uVar8 = uVar8 << 8;
        if (inData < pbVar25) {
          bVar21 = *inData;
          inData = inData + 1;
          uVar8 = uVar8 | bVar21;
        }
        uVar18 = uVar18 << 8;
        uVar28 = uVar28 << 8;
      } while( true );
    }
    uVar6 = *(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 10);
    if (uVar6 != 0) {
      uVar15 = *(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 0xc);
      if (uVar15 <= uVar6) goto LAB_00102e32;
      uVar10 = (ulong)uVar18;
      uVar18 = (uint)(uVar10 / uVar15);
      uVar9 = (uint)((ulong)(uVar8 - uVar28) / (uVar10 / uVar15));
      uVar22 = (uint)uVar6;
      if ((uVar9 & 0xffff) < uVar22) {
        uVar18 = uVar18 * uVar22;
        do {
          if (0xffffff < (uVar28 + uVar18 ^ uVar28)) {
            if (0xffff < uVar18) goto LAB_00102e32;
            uVar18 = -uVar28 & 0xffff;
          }
          uVar8 = uVar8 << 8;
          if (inData < pbVar25) {
            bVar21 = *inData;
            inData = inData + 1;
            uVar8 = uVar8 | bVar21;
          }
          uVar18 = uVar18 << 8;
          uVar28 = uVar28 << 8;
        } while( true );
      }
      if (*(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 8) == 0) {
        iVar19 = 1;
      }
      else {
        uVar9 = uVar9 - uVar22;
        local_38 = (ENetSymbol *)
                   ((long)context +
                   ((ulong)uVar26 +
                   (ulong)*(ushort *)
                           (*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 8)) *
                   0x10);
        local_7c = 0;
        uVar10 = 0;
        uVar20 = 0;
        pEVar14 = local_38;
        do {
          uVar6 = pEVar14->under;
          uVar17 = (int)uVar10 + (uint)uVar6;
          if ((ushort)uVar9 < (ushort)uVar17) {
            bVar21 = pEVar14->count;
            uVar17 = (uVar17 & 0xffff) - (uint)bVar21;
            if ((int)uVar17 <= (int)(uVar9 & 0xffff)) {
              local_7c = (uint)CONCAT71((int7)(uVar10 >> 8),pEVar14->value);
              uVar20 = uVar20 + bVar21;
              pEVar14->under = uVar6 + 2;
              pEVar14->count = bVar21 + 2;
              iVar19 = 9;
              unaff_R13 = pEVar14;
              goto LAB_00103210;
            }
            pEVar14->under = uVar6 + 2;
            if (pEVar14->left == 0) {
              iVar19 = 1;
            }
            else {
              pEVar14 = pEVar14 + pEVar14->left;
              iVar19 = 10;
            }
          }
          else {
            if (pEVar14->right == 0) {
              iVar19 = 1;
            }
            else {
              pEVar14 = pEVar14 + pEVar14->right;
              iVar19 = 10;
            }
LAB_00103210:
            uVar10 = (ulong)uVar17;
          }
        } while (iVar19 == 10);
        if (iVar19 == 9) {
          iVar19 = 0;
        }
        pauVar23 = local_70;
        pbVar25 = local_68;
        local_7e = uVar26;
        if (iVar19 == 0) {
          uVar28 = (((uint)uVar10 & 0xffff) + uVar22) * uVar18 + uVar28;
          uVar18 = uVar18 * (uVar20 & 0xffff);
          do {
            if (0xffffff < (uVar28 + uVar18 ^ uVar28)) {
              if (0xffff < uVar18) goto LAB_00103580;
              uVar18 = -uVar28 & 0xffff;
            }
            uVar8 = uVar8 << 8;
            if (inData < local_68) {
              bVar21 = *inData;
              inData = inData + 1;
              uVar8 = uVar8 | bVar21;
            }
            uVar18 = uVar18 << 8;
            uVar28 = uVar28 << 8;
          } while( true );
        }
      }
      goto LAB_0010351a;
    }
LAB_00102e32:
    uVar26 = *(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 0xe);
  } while( true );
LAB_001030df:
  local_60 = (long)unaff_R13 - (long)context;
  uVar6 = *(short *)(*(undefined1 (*) [16])context + 0xc) + 3;
  *(ushort *)(*(undefined1 (*) [16])context + 0xc) = uVar6;
  pauVar23 = (undefined1 (*) [16])context;
  if (0xff00 < uVar6 || 0xfa < uVar9) {
    if (*(ushort *)(*(undefined1 (*) [16])context + 8) == 0) {
      eVar7 = 0;
    }
    else {
      eVar7 = enet_symbol_rescale((ENetSymbol *)
                                  ((long)context +
                                  (ulong)*(ushort *)(*(undefined1 (*) [16])context + 8) * 0x10));
      context = local_70;
    }
    sVar12 = *(ushort *)(*(undefined1 (*) [16])context + 10) -
             (*(ushort *)(*(undefined1 (*) [16])context + 10) >> 1);
    *(short *)(*(undefined1 (*) [16])context + 10) = sVar12;
    *(enet_uint16 *)(*(undefined1 (*) [16])context + 0xc) = eVar7 + sVar12 + 0x100;
    pauVar23 = (undefined1 (*) [16])context;
  }
LAB_0010326e:
  peVar11 = &local_80;
  uVar16 = local_78;
  uVar6 = local_80;
  uVar15 = uVar26;
  uVar9 = local_7c;
  if (local_80 != uVar26) {
    do {
      local_7e = uVar15;
      pEVar14 = (ENetSymbol *)(pauVar23 + uVar6);
      uVar15 = *(ushort *)(pauVar23[uVar6] + 8);
      bVar21 = (byte)uVar9;
      unaff_R13 = pEVar14;
      if (uVar15 == 0) {
        pauVar23[uVar16][0] = bVar21;
        pauVar23[uVar16][1] = 2;
        *(undefined2 *)(pauVar23[uVar16] + 2) = 2;
        *(undefined8 *)(pauVar23[uVar16] + 4) = 0;
        *(undefined4 *)(pauVar23[uVar16] + 0xc) = 0;
        *(short *)(pauVar23[uVar6] + 8) = (short)((int)uVar16 * 0x10 + (uint)uVar6 * -0x10 >> 4);
LAB_0010340a:
        unaff_R13 = (ENetSymbol *)(pauVar23 + uVar16);
        uVar16 = uVar16 + 1;
        bVar21 = 0;
      }
      else {
        do {
          bVar2 = unaff_R13[uVar15].value;
          unaff_R13 = unaff_R13 + uVar15;
          while (bVar21 < bVar2) {
            unaff_R13->under = unaff_R13->under + 2;
            uVar6 = unaff_R13->left;
            if (uVar6 == 0) {
              pauVar23[uVar16][0] = bVar21;
              pauVar23[uVar16][1] = 2;
              *(undefined2 *)(pauVar23[uVar16] + 2) = 2;
              *(undefined8 *)(pauVar23[uVar16] + 4) = 0;
              *(undefined4 *)(pauVar23[uVar16] + 0xc) = 0;
              unaff_R13->left =
                   (enet_uint16)((uint)((int)(pauVar23 + uVar16) - (int)unaff_R13) >> 4);
              goto LAB_0010340a;
            }
            bVar2 = unaff_R13[uVar6].value;
            unaff_R13 = unaff_R13 + uVar6;
          }
          if (bVar21 <= bVar2) {
            bVar21 = unaff_R13->count;
            unaff_R13->under = unaff_R13->under + 2;
            unaff_R13->count = bVar21 + 2;
            goto LAB_0010340f;
          }
          uVar15 = unaff_R13->right;
        } while (uVar15 != 0);
        pEVar1 = (ENetSymbol *)(pauVar23 + uVar16);
        pauVar23[uVar16][0] = bVar21;
        pauVar23[uVar16][1] = 2;
        *(undefined2 *)(pauVar23[uVar16] + 2) = 2;
        *(undefined8 *)(pauVar23[uVar16] + 4) = 0;
        *(undefined4 *)(pauVar23[uVar16] + 0xc) = 0;
        unaff_R13->right = (enet_uint16)((uint)((int)pEVar1 - (int)unaff_R13) >> 4);
        bVar21 = 0;
        uVar16 = uVar16 + 1;
        unaff_R13 = pEVar1;
      }
LAB_0010340f:
      *peVar11 = (enet_uint16)((uint)((int)unaff_R13 - (int)pauVar23) >> 4);
      if (bVar21 == 0) {
        uVar3 = pEVar14->escapes;
        uVar4 = pEVar14->total;
        pEVar14->escapes = uVar3 + 5;
        pEVar14->total = uVar4 + 5;
      }
      uVar6 = pEVar14->total + 2;
      pEVar14->total = uVar6;
      local_78 = uVar16;
      if ((0xfb < bVar21) || (0xff00 < uVar6)) {
        if (pEVar14->symbols == 0) {
          eVar7 = 0;
        }
        else {
          eVar7 = enet_symbol_rescale(pEVar14 + pEVar14->symbols);
          pauVar23 = local_70;
          uVar26 = local_7e;
          uVar9 = local_7c;
        }
        eVar13 = pEVar14->escapes - (pEVar14->escapes >> 1);
        pEVar14->escapes = eVar13;
        pEVar14->total = eVar13 + eVar7;
      }
      peVar11 = &unaff_R13->parent;
      uVar16 = local_78;
      uVar6 = pEVar14->parent;
      uVar15 = local_7e;
    } while (pEVar14->parent != uVar26);
  }
  *peVar11 = (enet_uint16)(local_60 >> 4);
  iVar19 = 1;
  pbVar25 = local_68;
  if (local_50 < local_48) {
    *local_50 = (enet_uint8)uVar9;
    if (local_58 < 2) {
      local_58 = local_58 + 1;
    }
    else {
      local_80 = *(enet_uint16 *)(pauVar23[local_80] + 0xe);
      local_58 = 2;
    }
    local_50 = local_50 + 1;
    iVar19 = 0;
    if (0xffd < uVar16) {
      *pauVar23 = (undefined1  [16])0x0;
      *(undefined2 *)(*pauVar23 + 0xc) = 0x101;
      *(undefined4 *)(*pauVar23 + 8) = 0x10000;
      local_80 = 0;
      local_58 = 0;
      iVar19 = 0;
      uVar16 = 1;
    }
  }
LAB_0010351a:
  uVar26 = local_80;
  context = pauVar23;
  local_78 = uVar16;
  if (iVar19 != 0) {
    if (iVar19 == 2) {
      return (long)local_50 - (long)local_40;
    }
    return 0;
  }
  goto LAB_00102da9;
LAB_00103045:
  iVar19 = 2;
  goto LAB_0010351a;
LAB_00103580:
  local_60 = (long)unaff_R13 - (long)local_70;
  *(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 0xc) = uVar15 + 2;
  if ((0xff00 < (ushort)(uVar15 + 2)) || (0xfb < (uVar20 & 0xffff))) {
    eVar7 = enet_symbol_rescale(local_38);
    sVar12 = *(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 10) -
             (*(ushort *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 10) >> 1);
    *(short *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 10) = sVar12;
    *(enet_uint16 *)(*(undefined1 (*) [16])((long)context + (ulong)uVar26 * 0x10) + 0xc) =
         sVar12 + eVar7;
    pauVar23 = local_70;
    uVar26 = local_7e;
  }
  goto LAB_0010326e;
}

Assistant:

size_t
enet_range_coder_decompress (void * context, const enet_uint8 * inData, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inEnd = & inData [inLimit];
    enet_uint32 decodeLow = 0, decodeCode = 0, decodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;
#ifdef ENET_CONTEXT_EXCLUSION
    ENetExclude excludes [256];
    ENetExclude * nextExclude = excludes;
#endif
  
    if (rangeCoder == NULL || inLimit <= 0)
      return 0;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    ENET_RANGE_CODER_SEED;

    for (;;)
    {
        ENetSymbol * subcontext, * symbol, * patch;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value = 0;
        enet_uint16 code, under, count, bottom, * parent = & predicted, total;

        for (subcontext = & rangeCoder -> symbols [predicted];
             subcontext != root;
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            if (subcontext -> escapes <= 0)
              continue;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0) 
              ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, 0); 
#endif
            if (subcontext -> escapes >= total)
              continue;
            code = ENET_RANGE_CODER_READ (total);
            if (code < subcontext -> escapes) 
            {
                ENET_RANGE_CODER_DECODE (0, subcontext -> escapes, total); 
                continue;
            }
            code -= subcontext -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0)
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_EXCLUDED); 
            }
            else
#endif
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_NOT_EXCLUDED); 
            }
            bottom = symbol - rangeCoder -> symbols;
            ENET_RANGE_CODER_DECODE (subcontext -> escapes + under, count, total);
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            goto patchContexts;
        }

        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
          ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, ENET_CONTEXT_SYMBOL_MINIMUM);  
#endif
        code = ENET_RANGE_CODER_READ (total);
        if (code < root -> escapes)
        {
            ENET_RANGE_CODER_DECODE (0, root -> escapes, total);
            break;
        }
        code -= root -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_EXCLUDED); 
        }
        else
#endif
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_NOT_EXCLUDED); 
        }
        bottom = symbol - rangeCoder -> symbols;
        ENET_RANGE_CODER_DECODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA;
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    patchContexts:
        for (patch = & rangeCoder -> symbols [predicted];
             patch != subcontext;
             patch = & rangeCoder -> symbols [patch -> parent])
        {
            ENET_CONTEXT_ENCODE (patch, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            if (count <= 0)
            {
                patch -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                patch -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            patch -> total += ENET_SUBCONTEXT_SYMBOL_DELTA; 
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || patch -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (patch, 0);
        }
        * parent = bottom;

        ENET_RANGE_CODER_OUTPUT (value);

        if (order >= ENET_SUBCONTEXT_ORDER)
          predicted = rangeCoder -> symbols [predicted].parent;
        else
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }
                        
    return (size_t) (outData - outStart);
}